

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdgif.c
# Opt level: O0

JDIMENSION get_interlaced_row(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  long *plVar1;
  uint uVar2;
  undefined8 *puVar3;
  undefined1 *puVar4;
  long in_RSI;
  long in_RDI;
  JDIMENSION irow;
  JSAMPARRAY colormap;
  JDIMENSION col;
  JSAMPROW ptr;
  JSAMPROW sptr;
  int c;
  gif_source_ptr source;
  uint local_44;
  int local_34;
  undefined1 *local_30;
  byte *local_28;
  
  plVar1 = *(long **)(in_RSI + 0x38);
  switch(*(uint *)(in_RSI + 0x1a8) & 7) {
  case 0:
    local_44 = *(uint *)(in_RSI + 0x1a8) >> 3;
    break;
  default:
    local_44 = (*(uint *)(in_RSI + 0x1a8) >> 1) + *(int *)(in_RSI + 0x1b4);
    break;
  case 2:
  case 6:
    local_44 = (*(uint *)(in_RSI + 0x1a8) >> 2) + *(int *)(in_RSI + 0x1b0);
    break;
  case 4:
    local_44 = (*(uint *)(in_RSI + 0x1a8) >> 3) + *(int *)(in_RSI + 0x1ac);
  }
  puVar3 = (undefined8 *)
           (**(code **)(*(long *)(in_RDI + 8) + 0x38))
                     (in_RDI,*(undefined8 *)(in_RSI + 0x1a0),local_44,1,0);
  local_30 = (undefined1 *)**(undefined8 **)(in_RSI + 0x20);
  local_28 = (byte *)*puVar3;
  for (local_34 = *(int *)(in_RDI + 0x30); local_34 != 0; local_34 = local_34 + -1) {
    uVar2 = (uint)*local_28;
    *local_30 = *(undefined1 *)(*plVar1 + (long)(int)uVar2);
    puVar4 = local_30 + 2;
    local_30[1] = *(undefined1 *)(plVar1[1] + (long)(int)uVar2);
    local_30 = local_30 + 3;
    *puVar4 = *(undefined1 *)(plVar1[2] + (long)(int)uVar2);
    local_28 = local_28 + 1;
  }
  *(int *)(in_RSI + 0x1a8) = *(int *)(in_RSI + 0x1a8) + 1;
  return 1;
}

Assistant:

METHODDEF(JDIMENSION)
get_interlaced_row(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
{
  gif_source_ptr source = (gif_source_ptr)sinfo;
  register int c;
  register JSAMPROW sptr, ptr;
  register JDIMENSION col;
  register JSAMPARRAY colormap = source->colormap;
  JDIMENSION irow;

  /* Figure out which row of interlaced image is needed, and access it. */
  switch ((int)(source->cur_row_number & 7)) {
  case 0:                       /* first-pass row */
    irow = source->cur_row_number >> 3;
    break;
  case 4:                       /* second-pass row */
    irow = (source->cur_row_number >> 3) + source->pass2_offset;
    break;
  case 2:                       /* third-pass row */
  case 6:
    irow = (source->cur_row_number >> 2) + source->pass3_offset;
    break;
  default:                      /* fourth-pass row */
    irow = (source->cur_row_number >> 1) + source->pass4_offset;
  }
  sptr = *(*cinfo->mem->access_virt_sarray)
    ((j_common_ptr)cinfo, source->interlaced_image, irow, (JDIMENSION)1,
     FALSE);
  /* Scan the row, expand colormap, and output */
  ptr = source->pub.buffer[0];
  for (col = cinfo->image_width; col > 0; col--) {
    c = *sptr++;
    *ptr++ = colormap[CM_RED][c];
    *ptr++ = colormap[CM_GREEN][c];
    *ptr++ = colormap[CM_BLUE][c];
  }
  source->cur_row_number++;     /* for next time */
  return 1;
}